

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nestl_test.hpp
# Opt level: O2

void nestl::test::detail::print_tuple<char_const(&)[30],int&,char_const(&)[10],int&>
               (ostream *ostream,char (*args) [30],int *args_1,char (*args_2) [10],int *args_3)

{
  int local_20 [2];
  char (*local_18) [10];
  int local_10;
  char (*local_8) [30];
  
  local_20[0] = *args_3;
  local_10 = *args_1;
  local_18 = args_2;
  local_8 = args;
  print_tuple_impl<char,std::char_traits<char>,std::tuple<char_const*,int,char_const*,int>,0ul,1ul,2ul,3ul>
            (ostream,local_20);
  return;
}

Assistant:

void print_tuple(std::ostream& ostream, Args&&... args)
{
    print_tuple_impl(ostream, std::make_tuple(args...), gen_seq<sizeof...(Args)>());
}